

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp_server.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _func_int ***ppp_Var1;
  execution_context eVar2;
  typed_value<unsigned_short,_char> *ptVar3;
  char *pcVar4;
  const_iterator cVar5;
  long *plVar6;
  time_t tVar7;
  any *operand;
  unsigned_short *puVar8;
  service *psVar9;
  io_service io_service;
  thread worker;
  options_description opts;
  rudp_server server;
  variables_map values;
  io_context local_298;
  long *local_288 [2];
  long local_278 [2];
  _Any_data local_268;
  code *local_258;
  code *local_250;
  long *local_248 [2];
  long local_238 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_220 [24];
  void *local_208;
  undefined4 local_200;
  undefined8 local_1f8;
  undefined4 local_1f0;
  long local_1e8;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_1e0 [24];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [96];
  _Manager_type local_158;
  _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>,_std::_Select1st<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>_>
  local_148;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::_Select1st<std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  local_118;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_e8;
  code *local_c8 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_b8 [8];
  _Rb_tree_node_base local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  
  local_1c8._0_8_ = (pointer)local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_248,(string *)local_1c8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((pointer)local_1c8._0_8_ != (pointer)local_1b8) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
  }
  local_1c8._0_8_ = boost::program_options::options_description::add_options();
  ptVar3 = boost::program_options::value<unsigned_short>((unsigned_short *)0x0);
  local_c8[0] = (code *)CONCAT62(local_c8[0]._2_6_,8000);
  ptVar3 = boost::program_options::typed_value<unsigned_short,_char>::default_value
                     (ptVar3,(unsigned_short *)local_c8);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (local_1c8,(value_semantic *)"port,p",(char *)ptVar3);
  boost::program_options::options_description_easy_init::operator()(pcVar4,"help,h");
  boost::program_options::variables_map::variables_map((variables_map *)local_c8);
  local_e8.super_function_base.vtable = (vtable_base *)0x0;
  local_e8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_e8.super_function_base.functor._8_8_ = 0;
  local_e8.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_1c8,argc,argv,(options_description *)local_248,0,
             &local_e8);
  boost::program_options::store((basic_parsed_options *)local_1c8,(variables_map *)local_c8,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_1c8);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_e8);
  local_1c8._0_8_ = (pointer)local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"help","");
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_b8,(key_type *)local_1c8);
  if ((pointer)local_1c8._0_8_ != (pointer)local_1b8) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
  }
  if (cVar5._M_node == &local_b0) {
    tVar7 = time((time_t *)0x0);
    srand((uint)tVar7);
    boost::asio::io_context::io_context(&local_298);
    local_288[0] = local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"port","");
    operand = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_c8);
    puVar8 = boost::any_cast<unsigned_short_const&>(operand);
    local_268._M_unused._M_object = (void *)0x0;
    local_268._8_8_ = 0;
    local_250 = std::
                _Function_handler<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp_server.cpp:35:5)>
                ::_M_invoke;
    local_258 = std::
                _Function_handler<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp_server.cpp:35:5)>
                ::_M_manager;
    rudp::rudp_server::rudp_server
              ((rudp_server *)local_1c8,&local_298,*puVar8,
               (function<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&)>
                *)&local_268);
    if (local_258 != (code *)0x0) {
      (*local_258)(&local_268,&local_268,__destroy_functor);
    }
    if (local_288[0] != local_278) {
      operator_delete(local_288[0],local_278[0] + 1);
    }
    local_268._M_unused._M_object = (void *)0x0;
    local_288[0] = (long *)operator_new(0x10);
    *local_288[0] = (long)&PTR___State_0014bac8;
    local_288[0][1] = (long)&local_298;
    std::thread::_M_start_thread(&local_268,local_288,0);
    if (local_288[0] != (long *)0x0) {
      (**(code **)(*local_288[0] + 8))();
    }
    std::thread::join();
    if (local_268._M_unused._M_object != (void *)0x0) {
      std::terminate();
    }
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::_Select1st<std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
    ::~_Rb_tree(&local_118);
    std::
    _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>,_std::_Select1st<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>_>
    ::~_Rb_tree(&local_148);
    if (local_158 != (_Manager_type)0x0) {
      (*local_158)((_Any_data *)(local_1b8 + 0x50),(_Any_data *)(local_1b8 + 0x50),__destroy_functor
                  );
    }
    boost::asio::detail::
    io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                       *)local_1b8);
    for (psVar9 = (local_298.super_execution_context.service_registry_)->first_service_;
        eVar2.service_registry_ = local_298.super_execution_context.service_registry_,
        psVar9 != (service *)0x0; psVar9 = psVar9->next_) {
      (*psVar9->_vptr_service[2])(psVar9);
    }
    psVar9 = (local_298.super_execution_context.service_registry_)->first_service_;
    while (psVar9 != (service *)0x0) {
      ppp_Var1 = &psVar9->_vptr_service;
      psVar9 = psVar9->next_;
      (*(*ppp_Var1)[1])();
      (eVar2.service_registry_)->first_service_ = psVar9;
    }
    if (local_298.super_execution_context.service_registry_ != (service_registry *)0x0) {
      pthread_mutex_destroy
                ((pthread_mutex_t *)&(local_298.super_execution_context.service_registry_)->mutex_);
      operator_delete(local_298.super_execution_context.service_registry_,0x40);
    }
  }
  else {
    plVar6 = (long *)boost::program_options::operator<<
                               ((ostream *)&std::cout,(options_description *)local_248);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
  }
  local_c8[0] = std::thread::join;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_b8);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_1e0);
  if (local_208 != (void *)0x0) {
    operator_delete(local_208,local_1e8 - (long)local_208);
    local_208 = (void *)0x0;
    local_200 = 0;
    local_1f8 = 0;
    local_1f0 = 0;
    local_1e8 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_220);
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  return 0;
}

Assistant:

int main( int argc, char *argv[] ) {
  namespace po = boost::program_options;
  po::options_description opts( "Options" );
  opts.add_options()
    ( "port,p", po::value< uint16_t >()->default_value( 8000 ), "port" )
    ( "help,h", "display this message" );
  po::variables_map values;
  po::store( po::parse_command_line( argc, argv, opts ), values );
  if( values.count("help") ) {
    std::cout << opts << std::endl;
    return 0;
  }
  srand( time( nullptr ) );
  boost::asio::io_service io_service;
  rudp::rudp_server server( io_service, values[ "port" ].as< uint16_t >(),
    []( rudp::rudp_server &self, uint32_t ident, const rudp::buffers_ptr_t &bufs ) {
      std::cout << "received" << std::endl;
      for( auto &buf: *bufs ) {
        if( buf->size() >= 2 ) {
          const auto header_size = (*buf)[ 1 ];
          if( size_t( header_size ) < buf->size() )
            self.send( ident, std::next( buf->data(), header_size ), std::next( buf->data(), buf->size() ), []( bool status ) {
	      if( status ) { std::cout << "responded" << std::endl; } else { std::cout << "failed" << std::endl; }
	    } );
        }
      }
    }
  );
  std::thread worker( [&]() { io_service.run(); } );
  worker.join();
}